

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void yy_pop_parser_stack(yyParser *pParser)

{
  yyStackEntry *pyVar1;
  yyStackEntry *yytos;
  yyParser *pParser_local;
  
  pyVar1 = pParser->yytos;
  pParser->yytos = pyVar1 + -1;
  yy_destructor(pParser,pyVar1->major,&pyVar1->minor);
  return;
}

Assistant:

static void yy_pop_parser_stack(yyParser *pParser){
  yyStackEntry *yytos;
  assert( pParser->yytos!=0 );
  assert( pParser->yytos > pParser->yystack );
  yytos = pParser->yytos--;
#ifndef NDEBUG
  if( yyTraceFILE ){
    fprintf(yyTraceFILE,"%sPopping %s\n",
      yyTracePrompt,
      yyTokenName[yytos->major]);
  }
#endif
  yy_destructor(pParser, yytos->major, &yytos->minor);
}